

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAddCollateString(Parse *pParse,Expr *pExpr,char *zC)

{
  Expr *pEVar1;
  Parse *in_RDX;
  long in_FS_OFFSET;
  Token s;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Token *p;
  Expr *in_stack_ffffffffffffffc8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  p = (Token *)local_18;
  sqlite3TokenInit(p,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pEVar1 = sqlite3ExprAddCollateToken(in_RDX,in_stack_ffffffffffffffc8,p,in_stack_ffffffffffffffbc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pEVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateString(
  const Parse *pParse,  /* Parsing context */
  Expr *pExpr,          /* Add the "COLLATE" clause to this expression */
  const char *zC        /* The collating sequence name */
){
  Token s;
  assert( zC!=0 );
  sqlite3TokenInit(&s, (char*)zC);
  return sqlite3ExprAddCollateToken(pParse, pExpr, &s, 0);
}